

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_set.hpp
# Opt level: O3

pair<__gnu_cxx::__normal_iterator<Rml::PropertyId_*,_std::vector<Rml::PropertyId,_std::allocator<Rml::PropertyId>_>_>,_bool>
 __thiscall
itlib::
flat_set<Rml::PropertyId,_itlib::fsimpl::less,_std::vector<Rml::PropertyId,_std::allocator<Rml::PropertyId>_>_>
::insert<Rml::PropertyId>
          (flat_set<Rml::PropertyId,_itlib::fsimpl::less,_std::vector<Rml::PropertyId,_std::allocator<Rml::PropertyId>_>_>
           *this,PropertyId *val)

{
  PropertyId *pPVar1;
  PropertyId *pPVar2;
  __normal_iterator<Rml::PropertyId_*,_std::vector<Rml::PropertyId,_std::allocator<Rml::PropertyId>_>_>
  __position;
  undefined8 extraout_RDX;
  undefined8 uVar3;
  ulong uVar4;
  ulong uVar5;
  pair<__gnu_cxx::__normal_iterator<Rml::PropertyId_*,_std::vector<Rml::PropertyId,_std::allocator<Rml::PropertyId>_>_>,_bool>
  pVar6;
  
  __position._M_current =
       (this->m_container).super__Vector_base<Rml::PropertyId,_std::allocator<Rml::PropertyId>_>.
       _M_impl.super__Vector_impl_data._M_start;
  pPVar1 = (this->m_container).super__Vector_base<Rml::PropertyId,_std::allocator<Rml::PropertyId>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar4 = (long)pPVar1 - (long)__position._M_current;
  if (0 < (long)uVar4) {
    do {
      uVar5 = uVar4 >> 1;
      uVar4 = ~uVar5 + uVar4;
      pPVar2 = __position._M_current + uVar5 + 1;
      if (*val <= __position._M_current[uVar5]) {
        uVar4 = uVar5;
        pPVar2 = __position._M_current;
      }
      __position._M_current = pPVar2;
    } while (0 < (long)uVar4);
  }
  if ((__position._M_current == pPVar1) || (*val < *__position._M_current)) {
    __position._M_current =
         (PropertyId *)
         std::vector<Rml::PropertyId,_std::allocator<Rml::PropertyId>_>::_M_insert_rval
                   (&this->m_container,__position._M_current,val);
    uVar3 = CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
  }
  else {
    uVar3 = 0;
  }
  pVar6._8_8_ = uVar3;
  pVar6.first._M_current = __position._M_current;
  return pVar6;
}

Assistant:

std::pair<iterator, bool> insert(P&& val)
    {
        auto i = lower_bound(val);
        if (i != end() && !cmp()(val, *i))
        {
            return { i, false };
        }

        return{ m_container.emplace(i, std::forward<P>(val)), true };
    }